

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

size_t V_GetDim(Vector *V)

{
  LASErrIdType LVar1;
  size_t sVar2;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    sVar2 = V->Dim;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t V_GetDim(Vector *V)
/* returns dimension of the vector V */
{
    size_t Dim;

    if (LASResult() == LASOK)
        Dim = V->Dim;
    else
        Dim = 0;
    return(Dim);
}